

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_type_alignment_msl
          (CompilerMSL *this,SPIRType *type,bool is_packed,bool row_major)

{
  uint32_t uVar1;
  uint uVar2;
  CompilerError *pCVar3;
  uint32_t alignment;
  uint uVar4;
  uint32_t i;
  ulong uVar5;
  allocator local_41;
  string local_40;
  
  switch(*(undefined4 *)&(type->super_IVariant).field_0xc) {
  case 0:
  case 1:
  case 0xb:
  case 0x10:
  case 0x11:
  case 0x12:
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Querying alignment of opaque object.",&local_41);
    CompilerError::CompilerError(pCVar3,&local_40);
    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  default:
    if (is_packed) {
      uVar4 = type->width >> 3;
    }
    else {
      uVar2 = type->columns;
      if (type->columns < 2) {
        uVar2 = type->vecsize;
      }
      if (!row_major) {
        uVar2 = type->vecsize;
      }
      uVar4 = 4;
      if (uVar2 != 3) {
        uVar4 = uVar2;
      }
      uVar4 = uVar4 * (type->width >> 3);
    }
    break;
  case 9:
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"long types are not supported in buffers in MSL.",&local_41);
    CompilerError::CompilerError(pCVar3,&local_40);
    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 10:
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"ulong types are not supported in buffers in MSL.",&local_41);
    CompilerError::CompilerError(pCVar3,&local_40);
    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0xe:
    pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"double types are not supported in buffers in MSL.",&local_41);
    CompilerError::CompilerError(pCVar3,&local_40);
    __cxa_throw(pCVar3,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0xf:
    uVar4 = 1;
    for (uVar5 = 0;
        uVar5 < (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                buffer_size; uVar5 = (ulong)((uint32_t)uVar5 + 1)) {
      uVar1 = get_declared_struct_member_alignment_msl(this,type,(uint32_t)uVar5);
      if (uVar4 <= uVar1) {
        uVar4 = uVar1;
      }
    }
  }
  return uVar4;
}

Assistant:

uint32_t CompilerMSL::get_declared_type_alignment_msl(const SPIRType &type, bool is_packed, bool row_major) const
{
	switch (type.basetype)
	{
	case SPIRType::Unknown:
	case SPIRType::Void:
	case SPIRType::AtomicCounter:
	case SPIRType::Image:
	case SPIRType::SampledImage:
	case SPIRType::Sampler:
		SPIRV_CROSS_THROW("Querying alignment of opaque object.");

	case SPIRType::Int64:
		SPIRV_CROSS_THROW("long types are not supported in buffers in MSL.");
	case SPIRType::UInt64:
		SPIRV_CROSS_THROW("ulong types are not supported in buffers in MSL.");
	case SPIRType::Double:
		SPIRV_CROSS_THROW("double types are not supported in buffers in MSL.");

	case SPIRType::Struct:
	{
		// In MSL, a struct's alignment is equal to the maximum alignment of any of its members.
		uint32_t alignment = 1;
		for (uint32_t i = 0; i < type.member_types.size(); i++)
			alignment = max(alignment, uint32_t(get_declared_struct_member_alignment_msl(type, i)));
		return alignment;
	}

	default:
	{
		// Alignment of packed type is the same as the underlying component or column size.
		// Alignment of unpacked type is the same as the vector size.
		// Alignment of 3-elements vector is the same as 4-elements (including packed using column).
		if (is_packed)
		{
			// If we have packed_T and friends, the alignment is always scalar.
			return type.width / 8;
		}
		else
		{
			// This is the general rule for MSL. Size == alignment.
			uint32_t vecsize = (row_major && type.columns > 1) ? type.columns : type.vecsize;
			return (type.width / 8) * (vecsize == 3 ? 4 : vecsize);
		}
	}
	}
}